

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

bool __thiscall IR::Instr::IsRealInstr(Instr *this)

{
  OpCode OVar1;
  Instr *this_local;
  
  OVar1 = this->m_opcode;
  if ((((OVar1 == Label) || (OVar1 == StatementBoundary)) ||
      ((ushort)(OVar1 - CheckLowerIntBound) < 2)) ||
     (OVar1 == NoImplicitCallUses || OVar1 == NoIntOverflowBoundary)) {
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool
Instr::IsRealInstr() const
{
    switch (m_opcode)
    {
    case Js::OpCode::Label:
    case Js::OpCode::StatementBoundary:
    case Js::OpCode::NoImplicitCallUses:
    case Js::OpCode::NoIntOverflowBoundary:
#if DBG
    case Js::OpCode::CheckLowerIntBound:
    case Js::OpCode::CheckUpperIntBound:
#endif
        return false;

    default:
        return true;
    }
}